

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_190be::AsmWriteWLADX::writeCommentHelper
          (AsmWriteWLADX *this,int start_pos,int target_column,string *comment)

{
  FILE *__s;
  int iVar1;
  bool bVar2;
  ulong uVar3;
  
  if (comment->_M_string_length != 0) {
    bVar2 = true;
    uVar3 = 0;
    do {
      if (bVar2) {
        if (target_column < start_pos) {
          __assert_fail("target >= pos",
                        "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                        ,0xf2,
                        "int (anonymous namespace)::AsmWriteWLADX::indent_column(FILE *, int, int, bool)"
                       );
        }
        if (0x9f < target_column - start_pos) {
          __assert_fail("wanted_spaces <= 159",
                        "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                        ,0xf4,
                        "int (anonymous namespace)::AsmWriteWLADX::indent_column(FILE *, int, int, bool)"
                       );
        }
        __s = (FILE *)this->m_outFile;
        fwrite((anonymous_namespace)::AsmWriteWLADX::indent_column(_IO_FILE*,int,int,bool)::spaces,1
               ,(long)(target_column - start_pos),__s);
        bVar2 = false;
        iVar1 = fprintf(__s,"; ");
        start_pos = iVar1 + target_column;
      }
      iVar1 = (int)(comment->_M_dataplus)._M_p[uVar3];
      fputc(iVar1,(FILE *)this->m_outFile);
      if (iVar1 == 10) {
        bVar2 = true;
      }
      if (iVar1 == 10) {
        start_pos = 0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < comment->_M_string_length);
  }
  fputc(10,(FILE *)this->m_outFile);
  return;
}

Assistant:

void writeCommentHelper(const int start_pos, const int target_column, const std::string &comment) {

		if (comment.empty()) {
			fputc('\n', m_outFile);
			return;
		}

		int nw = start_pos;

		bool line_start = true;
		for (size_t i=0; i<comment.length(); ++i) {
			if (line_start) {
				nw = indent_column(m_outFile, target_column, nw, true);
				line_start = false;
			}
			char c = comment[i];
			fputc(c, m_outFile);
			if (c == '\n') {
				line_start = true;
				nw = 0;
			}
		}
		fputc('\n', m_outFile);
	}